

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O0

void Ga2_StructAnalize(Gia_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vInter,Vec_Int_t *vNewPPis)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  bool bVar3;
  int local_48;
  int local_44;
  int k;
  int i;
  Gia_Obj_t *pFanin;
  Gia_Obj_t *pObj;
  Vec_Int_t *vFanins;
  Vec_Int_t *vNewPPis_local;
  Vec_Int_t *vInter_local;
  Vec_Int_t *vFront_local;
  Gia_Man_t *p_local;
  
  local_44 = 0;
  while( true ) {
    bVar3 = false;
    if (local_44 < p->nObjs) {
      pFanin = Gia_ManObj(p,local_44);
      bVar3 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xbfffffffffffffff;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xffffffffbfffffff;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vFront);
    bVar3 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vFront,local_44);
      pFanin = Gia_ManObj(p,iVar1);
      bVar3 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xffffffffbfffffff | 0x40000000;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xbfffffffffffffff;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vInter);
    bVar3 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vInter,local_44);
      pFanin = Gia_ManObj(p,iVar1);
      bVar3 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xbfffffffffffffff;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xbfffffffffffffff | 0x4000000000000000;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNewPPis);
    bVar3 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vNewPPis,local_44);
      pFanin = Gia_ManObj(p,iVar1);
      bVar3 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xbfffffffffffffff | 0x4000000000000000;
    *(ulong *)pFanin = *(ulong *)pFanin & 0xbfffffffffffffff | 0x4000000000000000;
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vNewPPis);
    bVar3 = false;
    if (local_44 < iVar1) {
      iVar1 = Vec_IntEntry(vNewPPis,local_44);
      pFanin = Gia_ManObj(p,iVar1);
      bVar3 = pFanin != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    printf("Selected PPI %3d : ",(ulong)(local_44 + 1));
    uVar2 = Gia_ObjId(p,pFanin);
    printf("%6d ",(ulong)uVar2);
    printf("\n");
    p_00 = Ga2_ObjLeaves(p,pFanin);
    local_48 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p_00);
      bVar3 = false;
      if (local_48 < iVar1) {
        iVar1 = Vec_IntEntry(p_00,local_48);
        _k = Gia_ManObj(p,iVar1);
        bVar3 = _k != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      printf("    ");
      uVar2 = Gia_ObjId(p,_k);
      printf("%6d ",(ulong)uVar2);
      if (((*(ulong *)_k >> 0x1e & 1) == 0) || ((*(ulong *)_k >> 0x3e & 1) == 0)) {
        if (((*(ulong *)_k >> 0x1e & 1) == 0) || ((*(ulong *)_k >> 0x3e & 1) != 0)) {
          if (((*(ulong *)_k >> 0x1e & 1) == 0) && ((*(ulong *)_k >> 0x3e & 1) != 0)) {
            printf("abstracted node");
          }
          else if (((*(ulong *)_k >> 0x1e & 1) == 0) && ((*(ulong *)_k >> 0x3e & 1) == 0)) {
            printf("free variable");
          }
        }
        else {
          printf("frontier (original PI or PPI)");
        }
      }
      else {
        printf("selected PPI");
      }
      printf("\n");
      local_48 = local_48 + 1;
    }
    local_44 = local_44 + 1;
  }
  return;
}

Assistant:

void Ga2_StructAnalize( Gia_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vInter, Vec_Int_t * vNewPPis )
{
    Vec_Int_t * vFanins;
    Gia_Obj_t * pObj, * pFanin;
    int i, k;
    // clean labels
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = pObj->fMark1 = 0;
    // label frontier
    Gia_ManForEachObjVec( vFront, p, pObj, i )
        pObj->fMark0 = 1, pObj->fMark1 = 0;
    // label objects
    Gia_ManForEachObjVec( vInter, p, pObj, i )
        pObj->fMark1 = 0, pObj->fMark1 = 1;
    // label selected
    Gia_ManForEachObjVec( vNewPPis, p, pObj, i )
        pObj->fMark1 = 1, pObj->fMark1 = 1;
    // explore selected
    Gia_ManForEachObjVec( vNewPPis, p, pObj, i )
    {
        printf( "Selected PPI %3d : ", i+1 );
        printf( "%6d ",  Gia_ObjId(p, pObj) );
        printf( "\n" );
        vFanins = Ga2_ObjLeaves( p, pObj );
        Gia_ManForEachObjVec( vFanins, p, pFanin, k )
        {
            printf( "    " );
            printf( "%6d ", Gia_ObjId(p, pFanin) );
            if ( pFanin->fMark0 && pFanin->fMark1 )
                printf( "selected PPI" );
            else if ( pFanin->fMark0 && !pFanin->fMark1 )
                printf( "frontier (original PI or PPI)" );
            else if ( !pFanin->fMark0 &&  pFanin->fMark1 )
                printf( "abstracted node" );
            else if ( !pFanin->fMark0 && !pFanin->fMark1 )
                printf( "free variable" );
            printf( "\n" );
        }
    }
}